

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tournser.cpp
# Opt level: O3

void __thiscall
delta_complex_t::if_common_create
          (delta_complex_t *this,index_t cl,index_t v,index_t dim,char *filter,size_t thread,
          vector<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
          *new_cells,
          vector<std::vector<clique_t,_std::allocator<clique_t>_>,_std::allocator<std::vector<clique_t,_std::allocator<clique_t>_>_>_>
          *new_cliques,
          vector<std::vector<std::tuple<long,_long,_long>,_std::allocator<std::tuple<long,_long,_long>_>_>,_std::allocator<std::vector<std::tuple<long,_long,_long>,_std::allocator<std::tuple<long,_long,_long>_>_>_>_>
          *new_clique_cofaces,
          vector<std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>,_std::allocator<std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>_>
          *new_cell_cofaces)

{
  long *plVar1;
  pointer pcVar2;
  vector<long,_std::allocator<long>_> *pvVar3;
  pointer pvVar4;
  double dVar5;
  size_t sVar6;
  iterator iVar7;
  pointer pvVar8;
  long lVar9;
  int iVar10;
  long *plVar11;
  long lVar12;
  long lVar13;
  int iVar14;
  long lVar15;
  vector<long,_std::allocator<long>_> *__x;
  ulong uVar16;
  delta_complex_t *complex;
  vector<long,_std::allocator<long>_> new_vertices;
  string bin;
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  new_orients;
  long j;
  int *local_238;
  iterator iStack_230;
  int *local_228;
  vector<long,_std::allocator<long>_> local_218;
  long local_200;
  vector<long,_std::allocator<long>_> local_1f8;
  pointer local_1e0;
  long *local_1d8;
  delta_complex_t *local_1d0;
  long local_1c8;
  int local_1c0;
  int local_1bc;
  _Head_base<2UL,_long,_false> local_1b8;
  size_t local_1b0;
  long local_1a8;
  char *local_1a0;
  vector<long,_std::allocator<long>_> local_198;
  string local_180;
  vector<long,_std::allocator<long>_> local_160;
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  local_148;
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  local_130;
  undefined1 local_118 [64];
  pointer local_d8;
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  local_d0 [2];
  _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> local_98;
  _Hashtable<long,_std::pair<const_long,_int>,_std::allocator<std::pair<const_long,_int>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_68;
  
  local_200 = (dim + -1) * 3;
  lVar15 = *(long *)&(this->cliques).
                     super__Vector_base<std::vector<clique_t,_std::allocator<clique_t>_>,_std::allocator<std::vector<clique_t,_std::allocator<clique_t>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[dim + -1].
                     super__Vector_base<clique_t,_std::allocator<clique_t>_>._M_impl.
                     super__Vector_impl_data;
  lVar12 = cl * 0x70;
  if (v <= *(long *)(*(long *)(lVar15 + 0x20 + lVar12) + -8)) {
    return;
  }
  local_238 = (int *)0x0;
  iStack_230._M_current = (int *)0x0;
  local_228 = (int *)0x0;
  local_1e0 = (pointer)v;
  local_1b0 = thread;
  local_1a0 = filter;
  iVar7 = std::
          _Hashtable<long,_std::pair<const_long,_int>,_std::allocator<std::pair<const_long,_int>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find((_Hashtable<long,_std::pair<const_long,_int>,_std::allocator<std::pair<const_long,_int>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)(*(long *)&(((this->cells).
                                 super__Vector_base<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super__Vector_base<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>
                               )._M_impl + v * 0xe8 + 0xb0),*(key_type **)(lVar15 + 0x18 + lVar12));
  if (iStack_230._M_current == local_228) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&local_238,iStack_230,
               (int *)((long)iVar7.super__Node_iterator_base<std::pair<const_long,_int>,_false>.
                             _M_cur + 0x10));
  }
  else {
    *iStack_230._M_current =
         *(int *)((long)iVar7.super__Node_iterator_base<std::pair<const_long,_int>,_false>._M_cur +
                 0x10);
    iStack_230._M_current = iStack_230._M_current + 1;
  }
  pvVar8 = (this->cliques).
           super__Vector_base<std::vector<clique_t,_std::allocator<clique_t>_>,_std::allocator<std::vector<clique_t,_std::allocator<clique_t>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar15 = *(long *)((long)&(pvVar8->super__Vector_base<clique_t,_std::allocator<clique_t>_>).
                            _M_impl.super__Vector_impl_data + local_200 * 8);
  lVar13 = *(long *)(lVar15 + 0x18 + lVar12);
  local_1d0 = this;
  if (8 < (ulong)(*(long *)(lVar15 + 0x20 + lVar12) - lVar13)) {
    uVar16 = 1;
    lVar15 = 8;
    do {
      iVar7 = std::
              _Hashtable<long,_std::pair<const_long,_int>,_std::allocator<std::pair<const_long,_int>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find((_Hashtable<long,_std::pair<const_long,_int>,_std::allocator<std::pair<const_long,_int>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                      *)(*(long *)&(((local_1d0->cells).
                                     super__Vector_base<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->
                                   super__Vector_base<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>
                                   )._M_impl + (long)local_1e0 * 0xe8 + 0xb0),
                     (key_type *)(lVar13 + lVar15));
      if (iVar7.super__Node_iterator_base<std::pair<const_long,_int>,_false>._M_cur ==
          (__node_type *)0x0) goto LAB_001191e6;
      if (iStack_230._M_current == local_228) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&local_238,iStack_230,
                   (int *)((long)iVar7.super__Node_iterator_base<std::pair<const_long,_int>,_false>.
                                 _M_cur + 0x10));
      }
      else {
        *iStack_230._M_current =
             *(int *)((long)iVar7.super__Node_iterator_base<std::pair<const_long,_int>,_false>.
                            _M_cur + 0x10);
        iStack_230._M_current = iStack_230._M_current + 1;
      }
      uVar16 = uVar16 + 1;
      pvVar8 = (local_1d0->cliques).
               super__Vector_base<std::vector<clique_t,_std::allocator<clique_t>_>,_std::allocator<std::vector<clique_t,_std::allocator<clique_t>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar9 = *(long *)((long)&(pvVar8->super__Vector_base<clique_t,_std::allocator<clique_t>_>).
                               _M_impl.super__Vector_impl_data + local_200 * 8);
      lVar13 = *(long *)(lVar9 + 0x18 + lVar12);
      lVar15 = lVar15 + 8;
    } while (uVar16 < (ulong)(*(long *)(lVar9 + 0x20 + lVar12) - lVar13 >> 3));
  }
  local_1f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_1f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (long *)0x0;
  local_1f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (index_t *)0x0;
  lVar15 = *(long *)((long)&(pvVar8->super__Vector_base<clique_t,_std::allocator<clique_t>_>).
                            _M_impl.super__Vector_impl_data + local_200 * 8);
  plVar11 = *(long **)(lVar15 + 0x18 + lVar12);
  plVar1 = *(long **)(lVar15 + 0x20 + lVar12);
  if (plVar11 != plVar1) {
    do {
      local_118._0_8_ = *plVar11;
      if (local_1f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_1f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                  ((vector<long,std::allocator<long>> *)&local_1f8,
                   (iterator)
                   local_1f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_finish,(long *)local_118);
      }
      else {
        *local_1f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
         _M_finish = local_118._0_8_;
        local_1f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_1f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      plVar11 = plVar11 + 1;
    } while (plVar11 != plVar1);
    if (local_1f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_finish !=
        local_1f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      *local_1f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
       _M_finish = (long)local_1e0;
      local_1f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_1f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_finish + 1;
      goto LAB_00118c71;
    }
  }
  std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
            ((vector<long,std::allocator<long>> *)&local_1f8,
             (iterator)
             local_1f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish,(long *)&local_1e0);
LAB_00118c71:
  sVar6 = local_1b0;
  pvVar8 = (new_cliques->
           super__Vector_base<std::vector<clique_t,_std::allocator<clique_t>_>,_std::allocator<std::vector<clique_t,_std::allocator<clique_t>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar13 = local_1b0 * 3;
  pcVar2 = *(pointer *)
            ((long)&pvVar8[local_1b0].super__Vector_base<clique_t,_std::allocator<clique_t>_>.
                    _M_impl.super__Vector_impl_data + 8);
  lVar15 = *(long *)&pvVar8[local_1b0].super__Vector_base<clique_t,_std::allocator<clique_t>_>.
                     _M_impl.super__Vector_impl_data;
  std::vector<long,_std::allocator<long>_>::vector(&local_160,&local_1f8);
  local_1b8._M_head_impl = ((long)pcVar2 - lVar15 >> 4) * 0x6db6db6db6db6db7;
  clique_t::clique_t((clique_t *)local_118,&local_160,local_1b8._M_head_impl);
  std::vector<clique_t,_std::allocator<clique_t>_>::emplace_back<clique_t>
            (pvVar8 + sVar6,(clique_t *)local_118);
  std::
  _Hashtable<long,_std::pair<const_long,_long>,_std::allocator<std::pair<const_long,_long>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<long,_std::pair<const_long,_long>,_std::allocator<std::pair<const_long,_long>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)(local_118 + 0x38));
  if ((pointer)local_118._24_8_ != (pointer)0x0) {
    operator_delete((void *)local_118._24_8_,local_118._40_8_ - local_118._24_8_);
  }
  if ((pointer)local_118._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_118._0_8_,local_118._16_8_ - local_118._0_8_);
  }
  if (local_160.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_160.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_160.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_160.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_118._0_8_ = local_1b8._M_head_impl;
  local_118._8_8_ = local_1e0;
  local_118._16_8_ = cl;
  std::vector<std::tuple<long,long,long>,std::allocator<std::tuple<long,long,long>>>::
  emplace_back<std::tuple<long,long,long>>
            ((vector<std::tuple<long,long,long>,std::allocator<std::tuple<long,long,long>>> *)
             ((new_clique_cofaces->
              super__Vector_base<std::vector<std::tuple<long,_long,_long>,_std::allocator<std::tuple<long,_long,_long>_>_>,_std::allocator<std::vector<std::tuple<long,_long,_long>,_std::allocator<std::tuple<long,_long,_long>_>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start + sVar6),
             (tuple<long,_long,_long> *)local_118);
  if ((long)iStack_230._M_current - (long)local_238 == 0) {
    iVar10 = 0;
  }
  else {
    lVar15 = (long)iStack_230._M_current - (long)local_238 >> 2;
    lVar9 = 0;
    iVar10 = 0;
    do {
      iVar10 = iVar10 + (uint)(local_238[lVar9] == 2);
      lVar9 = lVar9 + 1;
    } while (lVar15 + (ulong)(lVar15 == 0) != lVar9);
  }
  local_1c8 = lVar13;
  local_1a8 = lVar12;
  dVar5 = ldexp(1.0,iVar10);
  if (0.0 < dVar5) {
    iVar14 = 0;
    local_1c0 = iVar10;
    do {
      local_218.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_218.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_finish = (long *)0x0;
      local_218.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (long *)0x0;
      toBinary_abi_cxx11_(&local_180,iVar14,iVar10);
      if (iStack_230._M_current != local_238) {
        uVar16 = 0;
        iVar10 = 0;
        do {
          local_118._0_8_ = SEXT48(local_238[uVar16]);
          if ((pointer)local_118._0_8_ == (pointer)0x2) {
            if (local_180._M_dataplus._M_p[iVar10] == '0') {
              local_118._0_8_ = 0;
              if (local_218.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  local_218.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                          (&local_218,
                           (iterator)
                           local_218.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                           super__Vector_impl_data._M_finish,(long *)local_118);
              }
              else {
                *local_218.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_finish = 0;
LAB_00118eac:
                local_218.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_218.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
              }
            }
            else {
              local_118._0_8_ = 1;
              if (local_218.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_finish !=
                  local_218.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                *local_218.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_finish = 1;
                goto LAB_00118eac;
              }
              std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                        (&local_218,
                         (iterator)
                         local_218.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                         super__Vector_impl_data._M_finish,(long *)local_118);
            }
            iVar10 = iVar10 + 1;
          }
          else if (local_218.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_finish ==
                   local_218.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage) {
            std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                      (&local_218,
                       (iterator)
                       local_218.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                       super__Vector_impl_data._M_finish,(long *)local_118);
          }
          else {
            *local_218.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish = local_118._0_8_;
            local_218.super__Vector_base<long,_std::allocator<long>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_218.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          uVar16 = uVar16 + 1;
        } while (uVar16 < (ulong)((long)iStack_230._M_current - (long)local_238 >> 2));
      }
      lVar15 = *(long *)((long)&(((local_1d0->cliques).
                                  super__Vector_base<std::vector<clique_t,_std::allocator<clique_t>_>,_std::allocator<std::vector<clique_t,_std::allocator<clique_t>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->
                                super__Vector_base<clique_t,_std::allocator<clique_t>_>)._M_impl.
                                super__Vector_impl_data + local_200 * 8);
      plVar11 = *(long **)(lVar15 + local_1a8);
      local_1d8 = *(long **)(lVar15 + 8 + local_1a8);
      complex = local_1d0;
      local_1bc = iVar14;
      if (plVar11 != local_1d8) {
        do {
          local_148.
          super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_148.
          super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_148.
          super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          lVar15 = *(long *)((long)&(((complex->cells).
                                      super__Vector_base<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->
                                    super__Vector_base<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>
                                    )._M_impl + local_200 * 8);
          pvVar3 = *(vector<long,_std::allocator<long>_> **)(lVar15 + 0x50 + *plVar11 * 0xe8);
          for (__x = *(vector<long,_std::allocator<long>_> **)(lVar15 + 0x48 + *plVar11 * 0xe8);
              __x != pvVar3; __x = __x + 1) {
            std::vector<long,_std::allocator<long>_>::vector
                      ((vector<long,_std::allocator<long>_> *)local_118,__x);
            std::
            vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
            ::push_back(&local_148,(value_type *)local_118);
            if ((pointer)local_118._0_8_ != (pointer)0x0) {
              operator_delete((void *)local_118._0_8_,local_118._16_8_ - local_118._0_8_);
            }
          }
          std::
          vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
          ::push_back(&local_148,&local_218);
          pvVar4 = (new_cells->
                   super__Vector_base<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          lVar15 = *(long *)((long)&(pvVar4->
                                    super__Vector_base<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>
                                    )._M_impl.super__Vector_impl_data + local_1c8 * 8 + 8);
          lVar12 = *(long *)((long)&(pvVar4->
                                    super__Vector_base<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>
                                    )._M_impl.super__Vector_impl_data + local_1c8 * 8);
          std::vector<long,_std::allocator<long>_>::vector(&local_198,&local_1f8);
          std::
          vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
          ::vector(&local_130,&local_148);
          delta_complex_cell_t::delta_complex_cell_t
                    ((delta_complex_cell_t *)local_118,&local_198,&local_130,0.0,
                     (lVar15 - lVar12 >> 3) * 0x34f72c234f72c235,local_1b8._M_head_impl);
          std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>::
          emplace_back<delta_complex_cell_t>
                    ((vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_> *)
                     ((long)&(pvVar4->
                             super__Vector_base<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>
                             )._M_impl.super__Vector_impl_data + local_1c8 * 8),
                     (delta_complex_cell_t *)local_118);
          std::
          _Hashtable<long,_std::pair<const_long,_int>,_std::allocator<std::pair<const_long,_int>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::~_Hashtable(&local_68);
          std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::
          ~_Rb_tree(&local_98);
          std::
          vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
          ::~vector(local_d0);
          complex = local_1d0;
          if ((pointer)local_118._48_8_ != (pointer)0x0) {
            operator_delete((void *)local_118._48_8_,(long)local_d8 - local_118._48_8_);
          }
          if ((pointer)local_118._24_8_ != (pointer)0x0) {
            operator_delete((void *)local_118._24_8_,local_118._40_8_ - local_118._24_8_);
          }
          if ((pointer)local_118._0_8_ != (pointer)0x0) {
            operator_delete((void *)local_118._0_8_,local_118._16_8_ - local_118._0_8_);
          }
          std::
          vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
          ::~vector(&local_130);
          if (local_198.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_198.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_198.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)local_198.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
          lVar15 = local_1c8;
          delta_complex_cell_t::compute_boundary
                    ((delta_complex_cell_t *)
                     (*(long *)((long)&(((new_cells->
                                         super__Vector_base<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
                                         )._M_impl.super__Vector_impl_data._M_start)->
                                       super__Vector_base<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>
                                       )._M_impl.super__Vector_impl_data + local_1c8 * 8 + 8) +
                     -0xe8),complex,local_1b0,new_cell_cofaces);
          delta_complex_cell_t::assign_filtration
                    ((delta_complex_cell_t *)
                     (*(long *)((long)&(((new_cells->
                                         super__Vector_base<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
                                         )._M_impl.super__Vector_impl_data._M_start)->
                                       super__Vector_base<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>
                                       )._M_impl.super__Vector_impl_data + lVar15 * 8 + 8) + -0xe8),
                     local_1a0,complex);
          std::
          vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
          ::~vector(&local_148);
          plVar11 = plVar11 + 1;
        } while (plVar11 != local_1d8);
      }
      iVar10 = local_1c0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_180._M_dataplus._M_p != &local_180.field_2) {
        operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
      }
      iVar14 = local_1bc;
      if (local_218.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_218.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_218.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_218.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      iVar14 = iVar14 + 1;
      local_1d8 = (long *)(double)iVar14;
      dVar5 = ldexp(1.0,iVar10);
    } while ((double)local_1d8 < dVar5);
  }
  if (local_1f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_1f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
LAB_001191e6:
  if (local_238 != (int *)0x0) {
    operator_delete(local_238,(long)local_228 - (long)local_238);
  }
  return;
}

Assistant:

void if_common_create(index_t cl, index_t v, index_t dim, const char* filter, size_t thread,
        std::vector<std::vector<delta_complex_cell_t>>& new_cells, std::vector<std::vector<clique_t>>& new_cliques,
        std::vector<std::vector<std::tuple<index_t, index_t, index_t>>>& new_clique_cofaces,std::vector<std::vector<std::pair<index_t, index_t>>>& new_cell_cofaces ){
		//This checks if the vertex v is a neighbour of all vertices in the clique cliques[dim-1][cl]
		//If it is we create a new clique and then compute all the orientations of the edges and create face for each

		//If v is smaller than the largest vertex in the clique we can ignore it,
		//because such a clique would have been constructed earlier
		//as we construct them by adding larger valued vertices at each step
		if(v <= cliques[dim-1][cl].vertices.back()) return;

		//For each vertex u in the clique check if it is a neighbour of v,
		//if it is the record the orientation of the edge(s) between u and v
		std::vector<int> orient;
		orient.push_back(cells[0][v].in_or_out.find(cliques[dim-1][cl].vertices[0])->second);
		for(int i = 1; i < cliques[dim-1][cl].vertices.size(); i++){
			auto it = cells[0][v].in_or_out.find(cliques[dim-1][cl].vertices[i]);
			if(it == cells[0][v].in_or_out.end()) return;
			orient.push_back(it->second);
		}

		//If we reach this point we know that v is a neighbour of all vertices in the clique
		//so we create a new clique by adding v to the previous vertex set
		//Store the cofaces we need to add to old clique, we do this later as need to know index once parrallel threads have combined
		std::vector<index_t> new_vertices;
		for(auto j : cliques[dim-1][cl].vertices) new_vertices.push_back(j);
		new_vertices.push_back(v);
		index_t cli_loc = new_cliques[thread].size();
		new_cliques[thread].push_back(clique_t(new_vertices,cli_loc));
        new_clique_cofaces[thread].push_back(std::make_tuple(cl,v,cli_loc));

		//compute number of bidirectional edges in new clique
		int num_bidirect = 0;
		for(int k = 0; k < orient.size(); k++){
			if(orient[k] == 2) num_bidirect++;
		}

		//take each number between 0 and the number of bidirection edges and represent it in binary_function
		//we use this to create all orientations of the edges
		for(int i = 0; i < pow(2,num_bidirect); i++){
			//create a new orientation matrix by taking the orientation matrix of the old clique_lookup
			//and add an new bottom row, in this new bottom row we orientate any unidirectional edges
			//in there unique way and then use the binary number to decide how the bidirectional  edges are orientated
			std::vector<index_t> top_row;
			std::string bin = toBinary(i,num_bidirect);
			int count = 0;
			for(int j = 0 ; j < orient.size(); j++){
				if(orient[j] == 2){
					if(bin[count] == '0'){ top_row.push_back(0);
					} else{ top_row.push_back(1); }
					count++;
				} else{
					top_row.push_back(orient[j]);
				}
			}
			//Here we add our new bottom row to each of the orientations of original clique
			for(auto f : cliques[dim-1][cl].faces){
				std::vector<std::vector<index_t>> new_orients;
				for(auto t : cells[dim-1][f].orientation) new_orients.push_back(t);
				new_orients.push_back(top_row);
				//We then create a new face with this orientation matrix
				//add out new face the new clique, and compute the boundary of the new face
				index_t loc = new_cells[thread].size();
				new_cells[thread].push_back(delta_complex_cell_t(new_vertices,new_orients,0,loc,cli_loc));
				new_cells[thread].back().compute_boundary(this,thread,new_cell_cofaces);
				new_cells[thread].back().assign_filtration(filter,this);
			}
		}
    }